

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::TestCaseInfo::TestCaseInfo
          (TestCaseInfo *this,StringRef _className,NameAndTags *_nameAndTags,
          SourceLineInfo *_lineInfo)

{
  SourceLineInfo *pSVar1;
  bool bVar2;
  TestCaseProperties rhs;
  char cVar3;
  size_type sVar4;
  size_t sVar5;
  SourceLineInfo *_lineInfo_00;
  ReusableStringStream *pRVar6;
  StringRef tag;
  StringRef tag_00;
  __normal_iterator<Catch::Tag_*,_std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>_> local_228;
  const_iterator local_220;
  Tag *local_218;
  __normal_iterator<Catch::Tag_*,_std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>_> local_210;
  __normal_iterator<Catch::Tag_*,_std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>_> local_208;
  const_iterator local_200;
  Tag *local_1f8;
  __normal_iterator<Catch::Tag_*,_std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>_> local_1f0;
  StringRef local_1e8;
  ReusableStringStream local_1d8;
  string local_1c8;
  char *local_1a8;
  char *pcStack_1a0;
  StringRef local_198;
  anon_unknown_26 *local_188;
  char *pcStack_180;
  anon_unknown_26 *local_178;
  char *pcStack_170;
  ReusableStringStream local_168;
  string local_158;
  undefined1 auStack_138 [8];
  StringRef tagStr;
  string local_118;
  ReusableStringStream local_f8;
  string local_e8;
  char local_c1;
  SourceLineInfo *pSStack_c0;
  char c;
  size_t idx;
  SourceLineInfo *pSStack_b0;
  bool inTag;
  size_t tagEnd;
  size_t tagStart;
  long local_90;
  unsigned_long requiredSize;
  StringRef originalTags;
  string local_60;
  StringRef local_40;
  SourceLineInfo *local_30;
  SourceLineInfo *_lineInfo_local;
  NameAndTags *_nameAndTags_local;
  TestCaseInfo *this_local;
  StringRef _className_local;
  size_type extraout_RDX;
  
  _className_local.m_start = (char *)_className.m_size;
  this_local = (TestCaseInfo *)_className.m_start;
  local_30 = _lineInfo;
  _lineInfo_local = (SourceLineInfo *)_nameAndTags;
  _nameAndTags_local = (NameAndTags *)this;
  bVar2 = StringRef::empty(&_nameAndTags->name);
  if (bVar2) {
    (anonymous_namespace)::makeDefaultName_abi_cxx11_();
    StringRef::StringRef(&local_40,&local_60);
  }
  else {
    local_40.m_start = _lineInfo_local->file;
    local_40.m_size = _lineInfo_local->line;
  }
  StringRef::operator_cast_to_string(&this->name,&local_40);
  if (bVar2) {
    std::__cxx11::string::~string((string *)&local_60);
  }
  (this->className).m_start = (char *)this_local;
  (this->className).m_size = (size_type)_className_local.m_start;
  std::__cxx11::string::string((string *)&this->backingTags);
  std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>::vector(&this->tags);
  sVar5 = local_30->line;
  (this->lineInfo).file = local_30->file;
  (this->lineInfo).line = sVar5;
  this->properties = None;
  requiredSize = (unsigned_long)_lineInfo_local[1].file;
  originalTags.m_start = (char *)_lineInfo_local[1].line;
  sVar4 = StringRef::size((StringRef *)&requiredSize);
  StringRef::StringRef((StringRef *)&tagStart,local_30->file);
  sVar5 = anon_unknown_26::sizeOfExtraTags(_tagStart);
  local_90 = sVar4 + sVar5;
  std::__cxx11::string::reserve((ulong)&this->backingTags);
  tagEnd = 0;
  pSStack_b0 = (SourceLineInfo *)0x0;
  idx._7_1_ = 0;
  pSStack_c0 = (SourceLineInfo *)0x0;
  do {
    pSVar1 = pSStack_c0;
    _lineInfo_00 = (SourceLineInfo *)StringRef::size((StringRef *)&requiredSize);
    if (_lineInfo_00 <= pSVar1) {
      if ((idx._7_1_ & 1) == 0) {
        bVar2 = isHidden(this);
        if (bVar2) {
          local_1e8 = operator____sr(".",1);
          internalAppendTag(this,local_1e8);
        }
        local_1f0._M_current =
             (Tag *)std::begin<std::vector<Catch::Tag,std::allocator<Catch::Tag>>>(&this->tags);
        local_1f8 = (Tag *)std::end<std::vector<Catch::Tag,std::allocator<Catch::Tag>>>(&this->tags)
        ;
        std::
        sort<__gnu_cxx::__normal_iterator<Catch::Tag*,std::vector<Catch::Tag,std::allocator<Catch::Tag>>>>
                  (local_1f0,
                   (__normal_iterator<Catch::Tag_*,_std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>_>
                    )local_1f8);
        local_210._M_current =
             (Tag *)std::begin<std::vector<Catch::Tag,std::allocator<Catch::Tag>>>(&this->tags);
        local_218 = (Tag *)std::end<std::vector<Catch::Tag,std::allocator<Catch::Tag>>>(&this->tags)
        ;
        local_208 = std::
                    unique<__gnu_cxx::__normal_iterator<Catch::Tag*,std::vector<Catch::Tag,std::allocator<Catch::Tag>>>>
                              (local_210,
                               (__normal_iterator<Catch::Tag_*,_std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>_>
                                )local_218);
        __gnu_cxx::
        __normal_iterator<Catch::Tag_const*,std::vector<Catch::Tag,std::allocator<Catch::Tag>>>::
        __normal_iterator<Catch::Tag*>
                  ((__normal_iterator<Catch::Tag_const*,std::vector<Catch::Tag,std::allocator<Catch::Tag>>>
                    *)&local_200,&local_208);
        local_228._M_current =
             (Tag *)std::end<std::vector<Catch::Tag,std::allocator<Catch::Tag>>>(&this->tags);
        __gnu_cxx::
        __normal_iterator<Catch::Tag_const*,std::vector<Catch::Tag,std::allocator<Catch::Tag>>>::
        __normal_iterator<Catch::Tag*>
                  ((__normal_iterator<Catch::Tag_const*,std::vector<Catch::Tag,std::allocator<Catch::Tag>>>
                    *)&local_220,&local_228);
        std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>::erase(&this->tags,local_200,local_220)
        ;
        return;
      }
      ReusableStringStream::ReusableStringStream(&local_1d8);
      pRVar6 = ReusableStringStream::operator<<
                         (&local_1d8,
                          (char (*) [52])"Found an unclosed tag while registering test case \'");
      pRVar6 = ReusableStringStream::operator<<(pRVar6,(StringRef *)_lineInfo_local);
      pRVar6 = ReusableStringStream::operator<<(pRVar6,(char (*) [6])"\' at ");
      pRVar6 = ReusableStringStream::operator<<(pRVar6,local_30);
      ReusableStringStream::str_abi_cxx11_(&local_1c8,pRVar6);
      throw_domain_error(&local_1c8);
    }
    local_c1 = StringRef::operator[]((StringRef *)&requiredSize,(size_type)pSStack_c0);
    if (local_c1 == '[') {
      if ((idx._7_1_ & 1) != 0) {
        ReusableStringStream::ReusableStringStream(&local_f8);
        pRVar6 = ReusableStringStream::operator<<
                           (&local_f8,
                            (char (*) [53])"Found \'[\' inside a tag while registering test case \'"
                           );
        pRVar6 = ReusableStringStream::operator<<(pRVar6,(StringRef *)_lineInfo_local);
        pRVar6 = ReusableStringStream::operator<<(pRVar6,(char (*) [6])"\' at ");
        pRVar6 = ReusableStringStream::operator<<(pRVar6,local_30);
        ReusableStringStream::str_abi_cxx11_(&local_e8,pRVar6);
        throw_domain_error(&local_e8);
      }
      idx._7_1_ = 1;
      tagEnd = (size_t)pSStack_c0;
    }
    if (local_c1 == ']') {
      if ((idx._7_1_ & 1) == 0) {
        ReusableStringStream::ReusableStringStream((ReusableStringStream *)&tagStr.m_size);
        pRVar6 = ReusableStringStream::operator<<
                           ((ReusableStringStream *)&tagStr.m_size,
                            (char (*) [50])"Found unmatched \']\' while registering test case \'");
        pRVar6 = ReusableStringStream::operator<<(pRVar6,(StringRef *)_lineInfo_local);
        pRVar6 = ReusableStringStream::operator<<(pRVar6,(char (*) [6])"\' at ");
        pRVar6 = ReusableStringStream::operator<<(pRVar6,local_30);
        ReusableStringStream::str_abi_cxx11_(&local_118,pRVar6);
        throw_domain_error(&local_118);
      }
      idx._7_1_ = 0;
      pSStack_b0 = pSStack_c0;
      if (pSStack_c0 <= tagEnd) {
        __assert_fail("tagStart < tagEnd",
                      "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp"
                      ,0x5f0,
                      "Catch::TestCaseInfo::TestCaseInfo(StringRef, const NameAndTags &, const SourceLineInfo &)"
                     );
      }
      _auStack_138 = StringRef::substr((StringRef *)&requiredSize,tagEnd + 1,
                                       (long)pSStack_c0 + (-1 - tagEnd));
      bVar2 = StringRef::empty((StringRef *)auStack_138);
      if (bVar2) {
        ReusableStringStream::ReusableStringStream(&local_168);
        pRVar6 = ReusableStringStream::operator<<
                           (&local_168,
                            (char (*) [49])"Found an empty tag while registering test case \'");
        pRVar6 = ReusableStringStream::operator<<(pRVar6,(StringRef *)_lineInfo_local);
        pRVar6 = ReusableStringStream::operator<<(pRVar6,(char (*) [6])"\' at ");
        pRVar6 = ReusableStringStream::operator<<(pRVar6,local_30);
        ReusableStringStream::str_abi_cxx11_(&local_158,pRVar6);
        throw_domain_error(&local_158);
      }
      local_178 = (anon_unknown_26 *)auStack_138;
      pcStack_170 = tagStr.m_start;
      tag.m_size = &this->lineInfo;
      tag.m_start = tagStr.m_start;
      anon_unknown_26::enforceNotReservedTag((anon_unknown_26 *)auStack_138,tag,_lineInfo_00);
      local_188 = (anon_unknown_26 *)auStack_138;
      pcStack_180 = tagStr.m_start;
      tag_00.m_size = extraout_RDX;
      tag_00.m_start = tagStr.m_start;
      rhs = anon_unknown_26::parseSpecialTag((anon_unknown_26 *)auStack_138,tag_00);
      anon_unknown_26::operator|=(&this->properties,rhs);
      sVar4 = StringRef::size((StringRef *)auStack_138);
      if ((1 < sVar4) && (cVar3 = StringRef::operator[]((StringRef *)auStack_138,0), cVar3 == '.'))
      {
        sVar4 = StringRef::size((StringRef *)auStack_138);
        local_198 = StringRef::substr((StringRef *)auStack_138,1,sVar4 - 1);
        _auStack_138 = local_198;
      }
      local_1a8 = (char *)auStack_138;
      pcStack_1a0 = tagStr.m_start;
      internalAppendTag(this,_auStack_138);
    }
    pSStack_c0 = (SourceLineInfo *)((long)&pSStack_c0->file + 1);
  } while( true );
}

Assistant:

TestCaseInfo::TestCaseInfo(StringRef _className,
                               NameAndTags const& _nameAndTags,
                               SourceLineInfo const& _lineInfo):
        name( _nameAndTags.name.empty() ? makeDefaultName() : _nameAndTags.name ),
        className( _className ),
        lineInfo( _lineInfo )
    {
        StringRef originalTags = _nameAndTags.tags;
        // We need to reserve enough space to store all of the tags
        // (including optional hidden tag and filename tag)
        auto requiredSize = originalTags.size() + sizeOfExtraTags(_lineInfo.file);
        backingTags.reserve(requiredSize);

        // We cannot copy the tags directly, as we need to normalize
        // some tags, so that [.foo] is copied as [.][foo].
        size_t tagStart = 0;
        size_t tagEnd = 0;
        bool inTag = false;
        for (size_t idx = 0; idx < originalTags.size(); ++idx) {
            auto c = originalTags[idx];
            if (c == '[') {
                CATCH_ENFORCE(
                    !inTag,
                    "Found '[' inside a tag while registering test case '"
                        << _nameAndTags.name << "' at " << _lineInfo );

                inTag = true;
                tagStart = idx;
            }
            if (c == ']') {
                CATCH_ENFORCE(
                    inTag,
                    "Found unmatched ']' while registering test case '"
                        << _nameAndTags.name << "' at " << _lineInfo );

                inTag = false;
                tagEnd = idx;
                assert(tagStart < tagEnd);

                // We need to check the tag for special meanings, copy
                // it over to backing storage and actually reference the
                // backing storage in the saved tags
                StringRef tagStr = originalTags.substr(tagStart+1, tagEnd - tagStart - 1);
                CATCH_ENFORCE( !tagStr.empty(),
                               "Found an empty tag while registering test case '"
                                   << _nameAndTags.name << "' at "
                                   << _lineInfo );

                enforceNotReservedTag(tagStr, lineInfo);
                properties |= parseSpecialTag(tagStr);
                // When copying a tag to the backing storage, we need to
                // check if it is a merged hide tag, such as [.foo], and
                // if it is, we need to handle it as if it was [foo].
                if (tagStr.size() > 1 && tagStr[0] == '.') {
                    tagStr = tagStr.substr(1, tagStr.size() - 1);
                }
                // We skip over dealing with the [.] tag, as we will add
                // it later unconditionally and then sort and unique all
                // the tags.
                internalAppendTag(tagStr);
            }
        }
        CATCH_ENFORCE( !inTag,
                       "Found an unclosed tag while registering test case '"
                           << _nameAndTags.name << "' at " << _lineInfo );


        // Add [.] if relevant
        if (isHidden()) {
            internalAppendTag("."_sr);
        }

        // Sort and prepare tags
        std::sort(begin(tags), end(tags));
        tags.erase(std::unique(begin(tags), end(tags)),
                   end(tags));
    }